

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flies.cpp
# Opt level: O3

int AF_A_FlySearch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  AActor *pAVar6;
  FState *newstate;
  uint uVar7;
  AActor *fly;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005df04b;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    fly = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (fly == (AActor *)0x0) {
LAB_005def12:
        fly = (AActor *)0x0;
        pVVar8 = param;
        uVar7 = numparam;
      }
      else {
        pPVar5 = (fly->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(fly->super_DThinker).super_DObject._vptr_DObject)(fly);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (fly->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar9 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        bVar10 = pPVar5 == pPVar3;
        if (!bVar10 && !bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
        uVar7 = (uint)bVar9;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005df04b;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005defd2;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005df03b;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar7,ret);
              puVar2[1] = pPVar5;
            }
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar9) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar9 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005df04b;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005df03b;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005defd2:
        validcount = validcount + 1;
        pAVar6 = FindCorpse(fly,fly->Sector,5);
        if (pAVar6 != (AActor *)0x0) {
          (fly->target).field_0.p = pAVar6;
          local_2c.Index = FName::NameManager::FindName(&FName::NameData,"Buzz",false);
          newstate = AActor::FindState(fly,&local_2c);
          AActor::SetState(fly,newstate,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005df04b;
    }
    if (fly == (AActor *)0x0) goto LAB_005def12;
  }
LAB_005df03b:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005df04b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                ,0x3f,"int AF_A_FlySearch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FlySearch)
{
	// The version from the retail beta is not so great for general use:
	// 1. Pick one of the first fifty thinkers at random.
	// 2. Starting from that thinker, find one that is an actor, not itself,
	//    and within sight. Give up after 100 sequential thinkers.
	// It's effectively useless if there are more than 150 thinkers on a map.
	//
	// So search the sectors instead. We can't potentially find something all
	// the way on the other side of the map and we can't find invisible corpses,
	// but at least we aren't crippled on maps with lots of stuff going on.
	PARAM_ACTION_PROLOGUE;

	validcount++;
	AActor *other = FindCorpse(self, self->Sector, 5);
	if (other != NULL)
	{
		self->target = other;
		self->SetState(self->FindState("Buzz"));
	}
	return 0;
}